

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::OrientedDiscMiIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  undefined1 auVar35 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  Primitive *local_238;
  RTCFilterFunctionNArguments local_230;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar6 = context->scene;
  uVar21 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  lVar8 = *(long *)&pGVar7->field_0x58;
  _Var9 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25 = *(undefined1 (*) [16])(lVar8 + _Var9 * uVar21);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar29 = *(undefined1 (*) [16])(lVar8 + _Var9 * uVar20);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar26 = *(undefined1 (*) [16])(lVar8 + _Var9 * uVar22);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar39 = *(undefined1 (*) [16])(lVar8 + _Var9 * uVar23);
  auVar42 = vunpcklps_avx(auVar25,auVar26);
  auVar31 = vunpckhps_avx(auVar25,auVar26);
  auVar25 = vunpcklps_avx(auVar29,auVar39);
  auVar32 = vunpckhps_avx(auVar29,auVar39);
  auVar16 = vunpcklps_avx(auVar42,auVar25);
  auVar15 = vunpckhps_avx(auVar42,auVar25);
  auVar17 = vunpcklps_avx(auVar31,auVar32);
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  p_Var10 = pGVar7[1].intersectionFilterN;
  auVar25 = *(undefined1 (*) [16])(lVar8 + uVar21 * (long)p_Var10);
  auVar29 = *(undefined1 (*) [16])(lVar8 + uVar20 * (long)p_Var10);
  auVar26 = *(undefined1 (*) [16])(lVar8 + uVar22 * (long)p_Var10);
  auVar39 = *(undefined1 (*) [16])(lVar8 + (long)p_Var10 * uVar23);
  auVar42 = vunpcklps_avx(auVar25,auVar26);
  auVar25 = vunpckhps_avx(auVar25,auVar26);
  auVar26 = vunpcklps_avx(auVar29,auVar39);
  auVar29 = vunpckhps_avx(auVar29,auVar39);
  local_190 = vunpcklps_avx(auVar25,auVar29);
  local_1b0 = vunpcklps_avx(auVar42,auVar26);
  local_1a0 = vunpckhps_avx(auVar42,auVar26);
  local_1f0 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar33 = *(float *)(ray + k * 4 + 0x20);
  auVar39._4_4_ = fVar33;
  auVar39._0_4_ = fVar33;
  auVar39._8_4_ = fVar33;
  auVar39._12_4_ = fVar33;
  fVar36 = *(float *)(ray + k * 4 + 0x40);
  auVar42._4_4_ = fVar36;
  auVar42._0_4_ = fVar36;
  auVar42._8_4_ = fVar36;
  auVar42._12_4_ = fVar36;
  fVar37 = *(float *)(ray + k * 4 + 0x80);
  fVar38 = *(float *)(ray + k * 4 + 0xa0);
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  auVar25._0_4_ = fVar37 * local_1b0._0_4_ + fVar38 * local_1a0._0_4_ + fVar1 * local_190._0_4_;
  auVar25._4_4_ = fVar37 * local_1b0._4_4_ + fVar38 * local_1a0._4_4_ + fVar1 * local_190._4_4_;
  auVar25._8_4_ = fVar37 * local_1b0._8_4_ + fVar38 * local_1a0._8_4_ + fVar1 * local_190._8_4_;
  auVar25._12_4_ = fVar37 * local_1b0._12_4_ + fVar38 * local_1a0._12_4_ + fVar1 * local_190._12_4_;
  auVar29 = vcmpps_avx(ZEXT416(0) << 0x20,auVar25,4);
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  auVar25 = vblendvps_avx(auVar44,auVar25,auVar29);
  auVar26 = vsubps_avx(auVar17,auVar42);
  auVar39 = vsubps_avx(auVar15,auVar39);
  fVar2 = *(float *)(ray + k * 4);
  auVar45._4_4_ = fVar2;
  auVar45._0_4_ = fVar2;
  auVar45._8_4_ = fVar2;
  auVar45._12_4_ = fVar2;
  auVar42 = vsubps_avx(auVar16,auVar45);
  auVar28._0_4_ =
       auVar39._0_4_ * local_1a0._0_4_ + auVar26._0_4_ * local_190._0_4_ +
       local_1b0._0_4_ * auVar42._0_4_;
  auVar28._4_4_ =
       auVar39._4_4_ * local_1a0._4_4_ + auVar26._4_4_ * local_190._4_4_ +
       local_1b0._4_4_ * auVar42._4_4_;
  auVar28._8_4_ =
       auVar39._8_4_ * local_1a0._8_4_ + auVar26._8_4_ * local_190._8_4_ +
       local_1b0._8_4_ * auVar42._8_4_;
  auVar28._12_4_ =
       auVar39._12_4_ * local_1a0._12_4_ + auVar26._12_4_ * local_190._12_4_ +
       local_1b0._12_4_ * auVar42._12_4_;
  local_1c0 = vdivps_avx(auVar28,auVar25);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar26._4_4_ = uVar3;
  auVar26._0_4_ = uVar3;
  auVar26._8_4_ = uVar3;
  auVar26._12_4_ = uVar3;
  auVar25 = vcmpps_avx(auVar26,local_1c0,2);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_200._4_4_ = uVar3;
  local_200._0_4_ = uVar3;
  local_200._8_4_ = uVar3;
  local_200._12_4_ = uVar3;
  auVar26 = vcmpps_avx(local_1c0,local_200,2);
  auVar25 = vandps_avx(auVar26,auVar25);
  auVar26 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar26 = vpcmpgtd_avx(auVar26,_DAT_01f4ad30);
  auVar25 = vandps_avx(auVar25,auVar26);
  auVar26 = auVar29 & auVar25;
  if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar26[0xf] < '\0') {
    auVar25 = vandps_avx(auVar29,auVar25);
    auVar42 = vunpckhps_avx(auVar31,auVar32);
    fVar11 = local_1c0._0_4_;
    fVar12 = local_1c0._4_4_;
    fVar13 = local_1c0._8_4_;
    fVar14 = local_1c0._12_4_;
    auVar32._0_4_ = fVar2 + fVar37 * fVar11;
    auVar32._4_4_ = fVar2 + fVar37 * fVar12;
    auVar32._8_4_ = fVar2 + fVar37 * fVar13;
    auVar32._12_4_ = fVar2 + fVar37 * fVar14;
    auVar34._0_4_ = fVar33 + fVar38 * fVar11;
    auVar34._4_4_ = fVar33 + fVar38 * fVar12;
    auVar34._8_4_ = fVar33 + fVar38 * fVar13;
    auVar34._12_4_ = fVar33 + fVar38 * fVar14;
    auVar40._0_4_ = fVar36 + fVar1 * fVar11;
    auVar40._4_4_ = fVar36 + fVar1 * fVar12;
    auVar40._8_4_ = fVar36 + fVar1 * fVar13;
    auVar40._12_4_ = fVar36 + fVar1 * fVar14;
    auVar29 = vsubps_avx(auVar32,auVar16);
    auVar26 = vsubps_avx(auVar34,auVar15);
    auVar39 = vsubps_avx(auVar40,auVar17);
    fVar33 = auVar26._0_4_ * auVar26._0_4_;
    fVar36 = auVar26._4_4_ * auVar26._4_4_;
    fVar37 = auVar26._8_4_ * auVar26._8_4_;
    fVar38 = auVar26._12_4_ * auVar26._12_4_;
    auVar31._0_4_ = auVar29._0_4_ * auVar29._0_4_ + fVar33 + auVar39._0_4_ * auVar39._0_4_;
    auVar31._4_4_ = auVar29._4_4_ * auVar29._4_4_ + fVar36 + auVar39._4_4_ * auVar39._4_4_;
    auVar31._8_4_ = auVar29._8_4_ * auVar29._8_4_ + fVar37 + auVar39._8_4_ * auVar39._8_4_;
    auVar31._12_4_ = auVar29._12_4_ * auVar29._12_4_ + fVar38 + auVar39._12_4_ * auVar39._12_4_;
    auVar29._0_4_ = auVar42._0_4_ * auVar42._0_4_;
    auVar29._4_4_ = auVar42._4_4_ * auVar42._4_4_;
    auVar29._8_4_ = auVar42._8_4_ * auVar42._8_4_;
    auVar29._12_4_ = auVar42._12_4_ * auVar42._12_4_;
    auVar29 = vcmpps_avx(auVar31,auVar29,1);
    auVar25 = vandps_avx(auVar29,auVar25);
    iVar18 = vmovmskps_avx(auVar25);
    if (iVar18 != 0) {
      local_1e0 = ZEXT832(0) << 0x20;
      uVar21 = (ulong)(byte)iVar18;
      uVar19 = 1 << ((byte)k & 0x1f);
      auVar30 = ZEXT1632(CONCAT412(fVar38,CONCAT48(fVar37,CONCAT44(fVar36,fVar33))));
      auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
      auVar35 = ZEXT3264(auVar30);
      auVar41 = ZEXT464(0) << 0x20;
      auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      do {
        local_230.hit = local_180;
        local_230.valid = (int *)local_260;
        uVar20 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar5 = *(uint *)(local_1f0 + uVar20 * 4);
        pGVar7 = (pSVar6->geometries).items[uVar5].ptr;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_1e0 + uVar20 * 4);
          local_100 = *(undefined4 *)(local_1e0 + uVar20 * 4 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar20 * 4);
          local_230.context = context->user;
          local_e0 = (Disc->primIDs).field_0.i[uVar20];
          uVar3 = *(undefined4 *)(local_1b0 + uVar20 * 4);
          uVar4 = *(undefined4 *)(local_1a0 + uVar20 * 4);
          local_160._4_4_ = uVar4;
          local_160._0_4_ = uVar4;
          local_160._8_4_ = uVar4;
          local_160._12_4_ = uVar4;
          local_160._16_4_ = uVar4;
          local_160._20_4_ = uVar4;
          local_160._24_4_ = uVar4;
          local_160._28_4_ = uVar4;
          local_b0 = vpshufd_avx(ZEXT416(uVar5),0);
          uVar4 = *(undefined4 *)(local_190 + uVar20 * 4);
          local_140._4_4_ = uVar4;
          local_140._0_4_ = uVar4;
          local_140._8_4_ = uVar4;
          local_140._12_4_ = uVar4;
          local_140._16_4_ = uVar4;
          local_140._20_4_ = uVar4;
          local_140._24_4_ = uVar4;
          local_140._28_4_ = uVar4;
          local_180[0] = (RTCHitN)(char)uVar3;
          local_180[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar3;
          local_180[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar3;
          local_180[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar3;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar3;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar3;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar3;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar3;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_230.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_230.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_260 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar19 & 0xf) << 4));
          local_250 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar19 >> 4) * 0x10);
          local_230.geometryUserPtr = pGVar7->userPtr;
          local_230.N = 8;
          local_230.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar30 = ZEXT1632(auVar35._0_16_);
            local_238 = Disc;
            (*pGVar7->occlusionFilterN)(&local_230);
            auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
            auVar35 = ZEXT3264(auVar30);
            Disc = local_238;
          }
          auVar25 = vpcmpeqd_avx(auVar41._0_16_,local_260);
          auVar29 = vpcmpeqd_avx(auVar41._0_16_,local_250);
          auVar30._16_16_ = auVar29;
          auVar30._0_16_ = auVar25;
          auVar30 = auVar35._0_32_ & ~auVar30;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0x7f,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar30 >> 0xbf,0) == '\0') &&
              (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar30[0x1f]) {
            auVar24._0_4_ = auVar25._0_4_ ^ auVar35._0_4_;
            auVar24._4_4_ = auVar25._4_4_ ^ auVar35._4_4_;
            auVar24._8_4_ = auVar25._8_4_ ^ auVar35._8_4_;
            auVar24._12_4_ = auVar25._12_4_ ^ auVar35._12_4_;
            auVar24._16_4_ = auVar29._0_4_ ^ auVar35._16_4_;
            auVar24._20_4_ = auVar29._4_4_ ^ auVar35._20_4_;
            auVar24._24_4_ = auVar29._8_4_ ^ auVar35._24_4_;
            auVar24._28_4_ = auVar29._12_4_ ^ auVar35._28_4_;
          }
          else {
            p_Var10 = context->args->filter;
            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              auVar30 = ZEXT1632(auVar35._0_16_);
              (*p_Var10)(&local_230);
              auVar43 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
              auVar35 = ZEXT3264(auVar30);
            }
            auVar25 = vpcmpeqd_avx(auVar41._0_16_,local_260);
            auVar29 = vpcmpeqd_avx(auVar41._0_16_,local_250);
            auVar27._16_16_ = auVar29;
            auVar27._0_16_ = auVar25;
            auVar24._0_4_ = auVar25._0_4_ ^ auVar35._0_4_;
            auVar24._4_4_ = auVar25._4_4_ ^ auVar35._4_4_;
            auVar24._8_4_ = auVar25._8_4_ ^ auVar35._8_4_;
            auVar24._12_4_ = auVar25._12_4_ ^ auVar35._12_4_;
            auVar24._16_4_ = auVar29._0_4_ ^ auVar35._16_4_;
            auVar24._20_4_ = auVar29._4_4_ ^ auVar35._20_4_;
            auVar24._24_4_ = auVar29._8_4_ ^ auVar35._24_4_;
            auVar24._28_4_ = auVar29._12_4_ ^ auVar35._28_4_;
            auVar30 = vblendvps_avx(auVar43._0_32_,*(undefined1 (*) [32])(local_230.ray + 0x100),
                                    auVar27);
            *(undefined1 (*) [32])(local_230.ray + 0x100) = auVar30;
          }
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            return true;
          }
          *(int *)(ray + k * 4 + 0x100) = local_200._0_4_;
        }
        uVar21 = uVar21 ^ 1L << (uVar20 & 0x3f);
      } while (uVar21 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }